

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
* Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *__return_storage_ptr__,
            vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *v1,vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                *v2)

{
  long lVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *this;
  pointer pTVar8;
  pointer pTVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *__s;
  pointer pTVar10;
  Tracker *arg;
  pointer pTVar11;
  size_type __n;
  Tracker *__cur;
  pointer pTVar12;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = ((long)(v2->
               super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(v2->
               super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
               )._M_impl.super__Vector_impl_data._M_start >> 4) +
        ((long)(v1->
               super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(v1->
               super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
               )._M_impl.super__Vector_impl_data._M_start >> 4);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(v1,__n);
  pTVar2 = (v2->
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __s = extraout_RDX;
  for (pTVar11 = (v2->
                 super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 )._M_impl.super__Vector_impl_data._M_start; pTVar11 != pTVar2;
      pTVar11 = pTVar11 + 1) {
    pTVar10 = (v1->
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar10 ==
        (v1->
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      this = (_Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)std::
                vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                ::_M_check_len(v1,__n,__s);
      pTVar3 = (v1->
               super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pTVar4 = (v1->
               super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pTVar8 = std::
               _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
               ::_M_allocate(this,__n);
      *(Tracker **)((long)pTVar8 + ((long)pTVar10 - (long)pTVar3)) = pTVar11->origin;
      *(int *)((long)pTVar8 + ((long)pTVar10 - (long)pTVar3) + 8) = pTVar11->copies + 1;
      pTVar9 = pTVar3;
      pTVar12 = pTVar8;
      if ((long)pTVar10 - (long)pTVar3 != 0) {
        do {
          pTVar12->origin = pTVar9->origin;
          pTVar12->copies = pTVar9->copies;
          pTVar9 = pTVar9 + 1;
          pTVar12 = pTVar12 + 1;
        } while (pTVar9 != pTVar10);
      }
      for (; pTVar9 = pTVar12 + 1, pTVar4 != pTVar10; pTVar10 = pTVar10 + 1) {
        pTVar9->origin = pTVar10->origin;
        pTVar12[1].copies = pTVar10->copies;
        pTVar12 = pTVar9;
      }
      __s = extraout_RDX_00;
      if (pTVar3 != (pointer)0x0) {
        __n = (long)(v1->
                    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar3;
        operator_delete(pTVar3,__n);
        __s = extraout_RDX_01;
      }
      (v1->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_start = pTVar8;
      (v1->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_finish = pTVar9;
      (v1->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar8 + (long)this;
    }
    else {
      pTVar10->origin = pTVar11->origin;
      pTVar10->copies = pTVar11->copies + 1;
      (v1->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_finish = pTVar10 + 1;
    }
  }
  uVar5 = *(undefined4 *)
           ((long)&(v1->
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                   )._M_impl.super__Vector_impl_data._M_start + 4);
  uVar6 = *(undefined4 *)
           &(v1->
            super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = *(undefined4 *)
           ((long)&(v1->
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 4);
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    )._M_impl.super__Vector_impl_data._M_start =
       *(undefined4 *)
        &(v1->
         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         )._M_impl.super__Vector_impl_data._M_start;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           )._M_impl.super__Vector_impl_data._M_start + 4) = uVar5;
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    )._M_impl.super__Vector_impl_data._M_finish = uVar6;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           )._M_impl.super__Vector_impl_data._M_finish + 4) = uVar7;
  (__return_storage_ptr__->
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (v1->
       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  (v1->
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (v1->
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (v1->
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

inline V Cat(V v1, const V& v2)
{
    v1.reserve(v1.size() + v2.size());
    for (const auto& arg : v2) {
        v1.push_back(arg);
    }
    return v1;
}